

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers-inl.h
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* spdlog::cfg::helpers::extract_kv_
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,char sep,string *str)

{
  long lVar1;
  string *__x;
  string *__y;
  undefined7 in_register_00000031;
  string v;
  string k;
  string local_40 [32];
  
  lVar1 = ::std::__cxx11::string::find((char)str,CONCAT71(in_register_00000031,sep));
  k._M_dataplus._M_p = (pointer)&k.field_2;
  k._M_string_length = 0;
  v._M_dataplus._M_p = (pointer)&v.field_2;
  v._M_string_length = 0;
  k.field_2._M_local_buf[0] = '\0';
  v.field_2._M_local_buf[0] = '\0';
  if (lVar1 == -1) {
    ::std::__cxx11::string::_M_assign((string *)&v);
  }
  else {
    ::std::__cxx11::string::substr((ulong)local_40,(ulong)str);
    ::std::__cxx11::string::operator=((string *)&k,local_40);
    ::std::__cxx11::string::~string(local_40);
    ::std::__cxx11::string::substr((ulong)local_40,(ulong)str);
    ::std::__cxx11::string::operator=((string *)&v,local_40);
    ::std::__cxx11::string::~string(local_40);
  }
  __x = trim_(&k);
  __y = trim_(&v);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (__return_storage_ptr__,__x,__y);
  ::std::__cxx11::string::~string((string *)&v);
  ::std::__cxx11::string::~string((string *)&k);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<std::string, std::string> extract_kv_(char sep, const std::string &str) {
    auto n = str.find(sep);
    std::string k, v;
    if (n == std::string::npos) {
        v = str;
    } else {
        k = str.substr(0, n);
        v = str.substr(n + 1);
    }
    return std::make_pair(trim_(k), trim_(v));
}